

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoInput.cpp
# Opt level: O1

Key * PianoInputTU::readRowBindings<Qt::Key*>(QSettings *settings,Key *dest,QString *key)

{
  int iVar1;
  Key KVar2;
  int i;
  
  iVar1 = QSettings::beginReadArray((QString *)settings);
  if (iVar1 == 0x18) {
    iVar1 = 0;
    do {
      QSettings::setArrayIndex((int)settings);
      KVar2 = readBinding(settings,(QString *)&Keys::key);
      *dest = KVar2;
      dest = dest + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0x18);
  }
  QSettings::endArray();
  return dest;
}

Assistant:

static Iter readRowBindings(QSettings &settings, Iter dest, QString const& key) {
    auto count = settings.beginReadArray(key);
    if (count == PianoInput::BindsPerRow) {
        for (int i = 0; i < count; ++i) {
            settings.setArrayIndex(i);
            *dest++ = TU::readBinding(settings, Keys::key);

        }
    }
    settings.endArray();
    return dest;
}